

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::StartCoverageLogXML(cmCTestCoverageHandler *this,cmXMLWriter *xml)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                    (this->super_cmCTestGenericHandler).AppendXML);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CoverageLog",(allocator<char> *)&local_30);
  cmXMLWriter::StartElement(xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"StartDateTime",&local_51);
  cmCTest::CurrentTime_abi_cxx11_(&local_30,(this->super_cmCTestGenericHandler).CTest);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"StartTime",&local_51);
  local_30._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (xml,&local_50,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmCTestCoverageHandler::StartCoverageLogXML(cmXMLWriter& xml)
{
  this->CTest->StartXML(xml, this->AppendXML);
  xml.StartElement("CoverageLog");
  xml.Element("StartDateTime", this->CTest->CurrentTime());
  xml.Element("StartTime", std::chrono::system_clock::now());
}